

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O3

bool __thiscall GenCADFile::parse_dimension_units(GenCADFile *this,mpc_ast_t *header_ast)

{
  char *pcVar1;
  mpc_ast_t **ppmVar2;
  bool bVar3;
  int iVar4;
  Dimension DVar5;
  mpc_ast_t *pmVar6;
  mpc_ast_t *pmVar7;
  
  pmVar6 = mpc_ast_get_child(header_ast,"units|>");
  this->m_dimension = INVALID;
  if ((pmVar6 == (mpc_ast_t *)0x0) || (pmVar6->children_num != 4)) {
LAB_0014c468:
    bVar3 = false;
  }
  else {
    pmVar7 = mpc_ast_get_child(pmVar6,"unit|dimension|string");
    if (pmVar7 == (mpc_ast_t *)0x0) {
      pmVar6 = mpc_ast_get_child(pmVar6,"unit|dimension|>");
      if (pmVar6->children_num != 3) goto LAB_0014c468;
      ppmVar2 = pmVar6->children;
      pmVar6 = *ppmVar2;
      if (pmVar6 == (mpc_ast_t *)0x0) {
LAB_0014c45f:
        if (this->m_dimension == INVALID) goto LAB_0014c468;
      }
      else {
        pcVar1 = pmVar6->contents;
        iVar4 = strcmp(pcVar1,"USER");
        if (iVar4 == 0) {
          DVar5 = USER;
        }
        else {
          iVar4 = strcmp(pcVar1,"USERM");
          if (iVar4 == 0) {
            DVar5 = USERCM;
          }
          else {
            iVar4 = strcmp(pcVar1,"USERMM");
            if (iVar4 != 0) goto LAB_0014c45f;
            DVar5 = USERMM;
          }
        }
        this->m_dimension = DVar5;
      }
      iVar4 = atoi(ppmVar2[2]->contents);
      this->m_dimension_unit = iVar4;
    }
    else {
      pcVar1 = pmVar7->contents;
      iVar4 = strcmp(pcVar1,"INCH");
      if (iVar4 == 0) {
        this->m_dimension = INCH;
      }
      else {
        iVar4 = strcmp(pcVar1,"THOU");
        if (iVar4 == 0) {
          this->m_dimension = THOU;
        }
        else {
          if (((*pcVar1 != 'M') || (pcVar1[1] != 'M')) || (pcVar1[2] != '\0')) {
            iVar4 = strcmp(pcVar1,"MM100");
            if (iVar4 != 0) {
              return true;
            }
            this->m_dimension = MM100;
            return true;
          }
          this->m_dimension = MM;
        }
      }
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool GenCADFile::parse_dimension_units(mpc_ast_t *header_ast) {
	mpc_ast_t *units = mpc_ast_get_child(header_ast, "units|>");
	m_dimension      = INVALID;
	if (!units) return false;

	if (units->children_num == 4) {
		// Try UNITS <unit> format
		mpc_ast_t *unit = mpc_ast_get_child(units, "unit|dimension|string");
		if (unit) {
			if (has_text_content(unit, "INCH")) {
				m_dimension = INCH;
			} else if (has_text_content(unit, "THOU")) {
				m_dimension = THOU;
			} else if (has_text_content(unit, "MM")) {
				m_dimension = MM;
			} else if (has_text_content(unit, "MM100")) {
				m_dimension = MM100;
			}
			return true;
		}

		// UNITS <unit> does not match -> try UNITS <unit> <dimension_unit>
		unit = mpc_ast_get_child(units, "unit|dimension|>");
		if (unit->children_num == 3) {
			mpc_ast_t *start_child = unit->children[0];
			if (has_text_content(start_child, "USER")) {
				m_dimension = USER;
			} else if (has_text_content(start_child, "USERM")) {
				m_dimension = USERCM;
			} else if (has_text_content(start_child, "USERMM")) {
				m_dimension = USERMM;
			}

			if (m_dimension != INVALID) {
				m_dimension_unit = atoi(unit->children[2]->contents);
				return true;
			}
		}
	}

	return false;
}